

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O1

int process(char *template,mustach_itf *itf,void *closure,FILE *file,char *opstr,char *clstr)

{
  byte *pbVar1;
  long lVar2;
  void *pvVar3;
  _func_int_void_ptr *p_Var4;
  _func_int_void_ptr_char_ptr *p_Var5;
  _func_int_void_ptr_char_ptr_int_FILE_ptr *p_Var6;
  mustach_itf *itf_00;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *__n;
  ushort **ppuVar10;
  FILE *pFVar11;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  uint uVar15;
  char *pcVar16;
  size_t *psVar17;
  byte *pbVar18;
  char *pcVar19;
  int iVar20;
  byte bVar21;
  size_t *__dest;
  long in_FS_OFFSET;
  bool bVar22;
  size_t local_2498;
  char *local_2490;
  FILE *local_2488;
  char *local_2480;
  void *local_2478;
  mustach_itf *local_2470;
  char *local_2468;
  int local_2460;
  int local_245c;
  char *local_2458;
  char *partial;
  anon_struct_32_5_7b674a85 stack [256];
  char name [1025];
  
  __dest = &local_2498;
  psVar17 = &local_2498;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_2488 = (FILE *)file;
  local_2468 = clstr;
  pcVar9 = strstr(template,opstr);
  pcVar19 = local_2468;
  if (pcVar9 == (char *)0x0) {
    iVar8 = 0;
    bVar22 = false;
  }
  else {
    local_2478 = closure;
    local_2470 = itf;
    local_2498 = strlen(local_2468);
    local_2490 = opstr;
    __n = (char *)strlen(opstr);
    local_2460 = 0;
    iVar8 = 1;
    do {
      pFVar11 = local_2488;
      if (iVar8 != 0) {
        *(undefined8 *)((long)__dest + -8) = 0x104d2c;
        fwrite(template,(long)pcVar9 - (long)template,1,pFVar11);
      }
      pbVar18 = (byte *)(pcVar9 + (long)__n);
      *(undefined8 *)((long)__dest + -8) = 0x104d3a;
      pcVar9 = strstr((char *)pbVar18,pcVar19);
      if (pcVar9 == (char *)0x0) {
        iVar8 = -2;
        goto LAB_00105309;
      }
      local_2480 = pcVar9 + local_2498;
      pcVar16 = pcVar9 + -(long)pbVar18;
      bVar21 = *pbVar18;
      uVar15 = bVar21 - 0x21;
      local_2468 = pcVar19;
      local_245c = iVar8;
      if (uVar15 < 0x3e) {
        if ((0x2000000020004024U >> ((ulong)uVar15 & 0x3f) & 1) != 0) goto LAB_00104d90;
        if ((0x10000001UL >> ((ulong)uVar15 & 0x3f) & 1) == 0) goto LAB_00104f51;
      }
      else {
LAB_00104f51:
        if (bVar21 == 0x7b) {
          for (lVar12 = 0; pcVar19[lVar12] == '}'; lVar12 = lVar12 + 1) {
          }
          if (pcVar19[lVar12] == '\0') {
            if (pcVar9[lVar12] != '}') {
              iVar8 = -8;
              goto LAB_00105309;
            }
            local_2480 = local_2480 + 1;
          }
          else {
            iVar8 = -8;
            if ((pcVar16 == (char *)0x0) || ((pbVar18 + -1)[(long)pcVar16] != 0x7d))
            goto LAB_00105309;
            pcVar16 = pcVar16 + -1;
          }
          bVar21 = 0x26;
LAB_00104d90:
          pbVar18 = pbVar18 + 1;
          pcVar16 = pcVar16 + -1;
        }
        if (pcVar16 != (char *)0x0) {
          *(undefined8 *)((long)__dest + -8) = 0x104da0;
          ppuVar10 = __ctype_b_loc();
          pbVar1 = pbVar18 + (long)pcVar16;
          do {
            if ((*(byte *)((long)*ppuVar10 + (long)(char)*pbVar18 * 2 + 1) & 0x20) == 0)
            goto LAB_00104dc2;
            pbVar18 = pbVar18 + 1;
            pcVar16 = pcVar16 + -1;
          } while (pcVar16 != (char *)0x0);
          pcVar16 = (char *)0x0;
          pbVar18 = pbVar1;
        }
LAB_00104dc2:
        pcVar16 = pcVar16 + 1;
        do {
          if (pcVar16 == (char *)0x1) {
            iVar8 = -3;
            goto LAB_00105309;
          }
          *(undefined8 *)((long)__dest + -8) = 0x104dd4;
          ppuVar10 = __ctype_b_loc();
          pbVar1 = pbVar18 + -2 + (long)pcVar16;
          pcVar16 = pcVar16 + -1;
        } while ((*(byte *)((long)*ppuVar10 + (long)(char)*pbVar1 * 2 + 1) & 0x20) != 0);
        if ((char *)0x400 < pcVar16) {
          iVar8 = -4;
          goto LAB_00105309;
        }
        *(undefined8 *)((long)__dest + -8) = 0x104e06;
        memcpy(&stack[0xff].emit,pbVar18,(size_t)pcVar16);
        *(char *)((long)&stack[0xff].emit + (long)pcVar16) = '\0';
      }
      pvVar3 = local_2478;
      pFVar11 = local_2488;
      iVar20 = local_2460;
      if (bVar21 < 0x3d) {
        if (bVar21 != 0x21) {
          if (bVar21 == 0x23) goto LAB_00104f71;
          if (bVar21 == 0x2f) {
            iVar8 = -7;
            iVar20 = local_2460 + -1;
            if ((local_2460 == 0) || (pcVar16 != stack[iVar20].again)) goto LAB_00105309;
            pvVar3 = *(void **)&stack[(long)iVar20 + -1].emit;
            *(undefined8 *)((long)__dest + -8) = 0x104e92;
            iVar7 = bcmp(pvVar3,&stack[0xff].emit,(size_t)pcVar16);
            pvVar3 = local_2478;
            iVar8 = -7;
            if (iVar7 != 0) goto LAB_00105309;
            iVar8 = 0;
            if ((local_245c != 0) && (*(int *)((long)&stack[iVar20].length + 4) != 0)) {
              p_Var4 = local_2470->next;
              *(undefined8 *)((long)__dest + -8) = 0x104ec2;
              iVar8 = (*p_Var4)(pvVar3);
            }
            pvVar3 = local_2478;
            if (iVar8 < 0) goto LAB_00105309;
            if (iVar8 == 0) {
              local_245c = (int)stack[iVar20].length;
              if (local_245c == 0) {
                local_245c = 0;
              }
              else if (*(int *)((long)&stack[iVar20].length + 4) != 0) {
                p_Var4 = local_2470->leave;
                *(undefined8 *)((long)__dest + -8) = 0x105205;
                (*p_Var4)(pvVar3);
              }
            }
            else {
              local_2480 = stack[iVar20].name;
              iVar20 = local_2460;
            }
          }
          else {
LAB_00104fd3:
            if (local_245c == 0) goto LAB_0010507c;
            p_Var6 = local_2470->put;
            *(undefined8 *)((long)__dest + -8) = 0x105008;
            iVar8 = (*p_Var6)(pvVar3,(char *)&stack[0xff].emit,SUB14(bVar21 != 0x26,0),
                              (FILE *)pFVar11);
joined_r0x00105272:
            iVar20 = local_2460;
            if (iVar8 < 0) goto LAB_00105309;
          }
        }
      }
      else if (bVar21 == 0x5e) {
LAB_00104f71:
        if (local_2460 == 0x100) {
          iVar8 = -6;
          goto LAB_00105309;
        }
        if (local_245c == 0) {
          iVar8 = 0;
        }
        else {
          p_Var5 = local_2470->enter;
          *(undefined8 *)((long)__dest + -8) = 0x104fa6;
          iVar8 = (*p_Var5)(pvVar3,(char *)&stack[0xff].emit);
          if (iVar8 < 0) goto LAB_00105309;
        }
        local_2480 = local_2480 + (*local_2480 == '\n');
        lVar12 = (long)local_2460;
        *(byte **)&stack[lVar12 + -1].emit = pbVar18;
        stack[lVar12].name = local_2480;
        stack[lVar12].again = pcVar16;
        *(int *)&stack[lVar12].length = local_245c;
        *(int *)((long)&stack[lVar12].length + 4) = iVar8;
        if ((iVar8 != 0) != (bVar21 == 0x23)) {
          local_245c = 0;
        }
        iVar20 = local_2460 + 1;
      }
      else if (bVar21 == 0x3e) {
        if (local_245c != 0) {
          local_2458 = (char *)0x0;
          *(undefined8 *)((long)__dest + -8) = 0x10502e;
          pFVar11 = tmpfile();
          pvVar3 = local_2478;
          if (pFVar11 == (FILE *)0x0) {
            iVar8 = -1;
          }
          else {
            p_Var6 = local_2470->put;
            *(undefined8 *)((long)__dest + -8) = 0x105057;
            iVar8 = (*p_Var6)(pvVar3,(char *)&stack[0xff].emit,0,(FILE *)pFVar11);
            if (iVar8 < 0) {
              *(undefined8 *)((long)__dest + -8) = 0x105219;
              fclose(pFVar11);
              local_2458 = (char *)0x0;
              partial = (char *)0x0;
            }
            else {
              *(undefined8 *)((long)__dest + -8) = 0x105075;
              iVar8 = memfile_close((FILE *)pFVar11,&local_2458,(size_t *)&partial);
            }
          }
          pcVar16 = local_2458;
          pcVar9 = local_2468;
          itf_00 = local_2470;
          pvVar3 = local_2478;
          pFVar11 = local_2488;
          pcVar19 = local_2490;
          if (iVar8 == 0) {
            *(undefined8 *)((long)__dest + -8) = 0x105262;
            iVar8 = process(pcVar16,itf_00,pvVar3,(FILE *)pFVar11,pcVar19,pcVar9);
            *(undefined8 *)((long)__dest + -8) = 0x10526d;
            free(pcVar16);
          }
          goto joined_r0x00105272;
        }
LAB_0010507c:
        local_245c = 0;
      }
      else {
        if (bVar21 != 0x3d) goto LAB_00104fd3;
        iVar8 = -5;
        if ((pcVar16 < (char *)0x5) || ((pcVar16 + -1)[(long)pbVar18] != '=')) goto LAB_00105309;
        pbVar18 = pbVar18 + 1;
        pcVar16 = pcVar16 + -2;
        if (pcVar16 == (char *)0x0) {
          __n = (char *)0x0;
        }
        else {
          *(undefined8 *)((long)__dest + -8) = 0x104f2a;
          ppuVar10 = __ctype_b_loc();
          pcVar19 = (char *)0x0;
          do {
            __n = pcVar19;
            if ((*(byte *)((long)*ppuVar10 + (long)(char)pbVar18[(long)pcVar19] * 2 + 1) & 0x20) !=
                0) break;
            pcVar19 = pcVar19 + 1;
            __n = pcVar16;
          } while (pcVar16 != pcVar19);
        }
        iVar8 = -5;
        if (__n == pcVar16) goto LAB_00105309;
        lVar12 = -((ulong)(__n + 0x10) & 0xfffffffffffffff0);
        pcVar9 = (char *)((long)__dest + lVar12);
        builtin_strncpy((char *)((long)__dest + lVar12 + -8),"XQ\x10",4);
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        memcpy(pcVar9,pbVar18,(size_t)__n);
        local_2490 = pcVar9;
        __n[(long)pcVar9] = '\0';
        pcVar19 = __n;
        if (__n < pcVar16) {
          builtin_strncpy((char *)((long)__dest + lVar12 + -8),"rQ\x10",4);
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          ppuVar10 = __ctype_b_loc();
          pcVar13 = __n;
          do {
            pcVar19 = pcVar13;
            if ((*(byte *)((long)*ppuVar10 + (long)(char)pbVar18[(long)pcVar13] * 2 + 1) & 0x20) ==
                0) break;
            pcVar13 = pcVar13 + 1;
            pcVar19 = pcVar16;
          } while (pcVar16 != pcVar13);
        }
        sVar14 = (long)pcVar16 - (long)pcVar19;
        iVar8 = -5;
        __dest = (size_t *)pcVar9;
        if (sVar14 == 0) goto LAB_00105309;
        __dest = (size_t *)(pcVar9 + -(sVar14 + 0x10 & 0xfffffffffffffff0));
        *(char *)((long)__dest + -8) = -0x41;
        *(char *)((long)__dest + -7) = 'Q';
        *(char *)((long)__dest + -6) = '\x10';
        *(char *)((long)__dest + -5) = '\0';
        *(char *)((long)__dest + -4) = '\0';
        *(char *)((long)__dest + -3) = '\0';
        *(char *)((long)__dest + -2) = '\0';
        *(char *)((long)__dest + -1) = '\0';
        memcpy(__dest,pbVar18 + (long)pcVar19,sVar14);
        local_2468 = (char *)__dest;
        *(char *)((long)__dest + sVar14) = '\0';
        local_2498 = sVar14;
        iVar20 = local_2460;
      }
      local_2460 = iVar20;
      template = local_2480;
      pcVar19 = local_2490;
      *(char *)((long)__dest + -8) = -0x60;
      *(char *)((long)__dest + -7) = 'R';
      *(char *)((long)__dest + -6) = '\x10';
      *(char *)((long)__dest + -5) = '\0';
      *(char *)((long)__dest + -4) = '\0';
      *(char *)((long)__dest + -3) = '\0';
      *(char *)((long)__dest + -2) = '\0';
      *(char *)((long)__dest + -1) = '\0';
      pcVar9 = strstr(template,pcVar19);
      pcVar19 = local_2468;
      iVar8 = local_245c;
    } while (pcVar9 != (char *)0x0);
    bVar22 = local_245c == 0;
    iVar8 = (uint)(local_2460 == 0) * 2 + -2;
    psVar17 = __dest;
  }
  __dest = psVar17;
  if (!bVar22) {
    *(undefined8 *)((long)psVar17 + -8) = 0x1052ef;
    sVar14 = strlen(template);
    pFVar11 = local_2488;
    *(undefined8 *)((long)psVar17 + -8) = 0x105306;
    fwrite(template,sVar14,1,pFVar11);
  }
LAB_00105309:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    *(code **)((long)__dest + -8) = fdmustach;
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

static int process(const char *template, struct mustach_itf *itf, void *closure, FILE *file, const char *opstr, const char *clstr)
{
	char name[NAME_LENGTH_MAX + 1], *partial, c, *tmp;
	const char *beg, *term;
	struct { const char *name, *again; size_t length; int emit, entered; } stack[DEPTH_MAX];
	size_t oplen, cllen, len, l;
	int depth, rc, emit;

	emit = 1;
	oplen = strlen(opstr);
	cllen = strlen(clstr);
	depth = 0;
	for(;;) {
		beg = strstr(template, opstr);
		if (beg == NULL) {
			/* no more mustach */
			if (emit)
				fwrite(template, strlen(template), 1, file);
			return depth ? MUSTACH_ERROR_UNEXPECTED_END : 0;
		}
		if (emit)
			fwrite(template, (size_t)(beg - template), 1, file);
		beg += oplen;
		term = strstr(beg, clstr);
		if (term == NULL)
			return MUSTACH_ERROR_UNEXPECTED_END;
		template = term + cllen;
		len = (size_t)(term - beg);
		c = *beg;
		switch(c) {
		case '!':
		case '=':
			break;
		case '{':
			for (l = 0 ; clstr[l] == '}' ; l++);
			if (clstr[l]) {
				if (!len || beg[len-1] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				len--;
			} else {
				if (term[l] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				template++;
			}
			c = '&';
			/*@fallthrough@*/
		case '^':
		case '#':
		case '/':
		case '&':
		case '>':
#if !defined(NO_EXTENSION_FOR_MUSTACH) && !defined(NO_COLON_EXTENSION_FOR_MUSTACH)
		case ':':
#endif
			beg++; len--;
		default:
			while (len && isspace(beg[0])) { beg++; len--; }
			while (len && isspace(beg[len-1])) len--;
#if defined(NO_EXTENSION_FOR_MUSTACH) || defined(NO_ALLOW_EMPTY_TAG)
			if (len == 0)
				return MUSTACH_ERROR_EMPTY_TAG;
#endif
			if (len > NAME_LENGTH_MAX)
				return MUSTACH_ERROR_TAG_TOO_LONG;
			memcpy(name, beg, len);
			name[len] = 0;
			break;
		}
		switch(c) {
		case '!':
			/* comment */
			/* nothing to do */
			break;
		case '=':
			/* defines separators */
			if (len < 5 || beg[len - 1] != '=')
				return MUSTACH_ERROR_BAD_SEPARATORS;
			beg++;
			len -= 2;
			for (l = 0; l < len && !isspace(beg[l]) ; l++);
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			oplen = l;
			tmp = alloca(oplen + 1);
			memcpy(tmp, beg, oplen);
			tmp[oplen] = 0;
			opstr = tmp;
			while (l < len && isspace(beg[l])) l++;
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			cllen = len - l;
			tmp = alloca(cllen + 1);
			memcpy(tmp, beg + l, cllen);
			tmp[cllen] = 0;
			clstr = tmp;
			break;
		case '^':
		case '#':
			/* begin section */
			if (depth == DEPTH_MAX)
				return MUSTACH_ERROR_TOO_DEEP;
			rc = emit;
			if (rc) {
				rc = itf->enter(closure, name);
				if (rc < 0)
					return rc;
			}

			if (template[0] == '\n')
				++template;

			stack[depth].name = beg;
			stack[depth].again = template;
			stack[depth].length = len;
			stack[depth].emit = emit;
			stack[depth].entered = rc;
			if ((c == '#') == (rc == 0))
				emit = 0;
			depth++;
			break;
		case '/':
			/* end section */
			if (depth-- == 0 || len != stack[depth].length || memcmp(stack[depth].name, name, len))
				return MUSTACH_ERROR_CLOSING;
			rc = emit && stack[depth].entered ? itf->next(closure) : 0;
			if (rc < 0)
				return rc;
			if (rc) {
				template = stack[depth++].again;
			} else {
				emit = stack[depth].emit;
				if (emit && stack[depth].entered)
					itf->leave(closure);
			}
			break;
		case '>':
			/* partials */
			if (emit) {
				rc = getpartial(itf, closure, name, &partial);
				if (rc == 0) {
					rc = process(partial, itf, closure, file, opstr, clstr);
					free(partial);
				}
				if (rc < 0)
					return rc;
			}
			break;
		default:
			/* replacement */
			if (emit) {
				rc = itf->put(closure, name, c != '&', file);
				if (rc < 0)
					return rc;
			}
			break;
		}
	}
}